

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::initShaderObjects
          (GeometryShaderInvalidArrayedInputVariablesTest *this,GLenum gs_input_primitive_type,
          bool *out_has_fs_compiled_successfully,bool *out_has_gs_compiled_successfully,
          bool *out_has_vs_compiled_successfully)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLuint *pGVar5;
  uint n_shader_type;
  bool *pbVar6;
  GLint compile_status;
  char *so_code;
  string specialized_vs_code;
  string specialized_gs_code;
  string gs_code;
  string specialized_fs_code;
  char *gs_code_raw;
  int local_104;
  GLuint *local_100;
  GLuint *local_f8;
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  bool *local_d8;
  bool *local_d0;
  bool *local_c8;
  pointer local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  pointer local_38;
  long lVar4;
  
  local_d8 = out_has_fs_compiled_successfully;
  local_d0 = out_has_gs_compiled_successfully;
  local_c8 = out_has_vs_compiled_successfully;
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  TestCaseBase::specializeShader_abi_cxx11_(&local_58,&this->super_TestCaseBase,1,&dummy_fs_code);
  local_e0 = local_58._M_dataplus._M_p;
  getGSCode_abi_cxx11_(&local_78,this,gs_input_primitive_type);
  local_38 = local_78._M_dataplus._M_p;
  TestCaseBase::specializeShader_abi_cxx11_(&local_98,&this->super_TestCaseBase,1,&local_38);
  local_e8 = local_98._M_dataplus._M_p;
  getSpecializedVSCode_abi_cxx11_(&local_b8,this);
  local_f0 = local_b8._M_dataplus._M_p;
  GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8b30);
  this->m_fs_id = GVar2;
  GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar2;
  GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x2f1);
  local_f8 = &this->m_fs_id;
  local_100 = &this->m_gs_id;
  iVar1 = 0;
  do {
    pbVar6 = local_c8;
    if (iVar1 == 1) {
      pbVar6 = local_d0;
    }
    local_104 = 0;
    pGVar5 = &this->m_vs_id;
    local_c0 = local_f0;
    if (iVar1 == 1) {
      pGVar5 = local_100;
      local_c0 = local_e8;
    }
    if (iVar1 == 0) {
      pGVar5 = local_f8;
      pbVar6 = local_d8;
      local_c0 = local_e0;
    }
    GVar2 = *pGVar5;
    (**(code **)(lVar4 + 0x12b8))(GVar2,1,&local_c0,0);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glShaderSource() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x304);
    (**(code **)(lVar4 + 0x248))(GVar2);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glCompileShader() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x307);
    (**(code **)(lVar4 + 0xa70))(GVar2,0x8b81,&local_104);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x30a);
    *pbVar6 = local_104 == 1;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GeometryShaderInvalidArrayedInputVariablesTest::initShaderObjects(glw::GLenum gs_input_primitive_type,
																	   bool*	   out_has_fs_compiled_successfully,
																	   bool*	   out_has_gs_compiled_successfully,
																	   bool*	   out_has_vs_compiled_successfully)
{
	const glw::Functions& gl					  = m_context.getRenderContext().getFunctions();
	std::string			  specialized_fs_code	 = specializeShader(1, &dummy_fs_code);
	const char*			  specialized_fs_code_raw = specialized_fs_code.c_str();
	std::string			  gs_code				  = getGSCode(gs_input_primitive_type);
	const char*			  gs_code_raw			  = gs_code.c_str();
	std::string			  specialized_gs_code	 = specializeShader(1, &gs_code_raw);
	const char*			  specialized_gs_code_raw = specialized_gs_code.c_str();
	std::string			  specialized_vs_code	 = getSpecializedVSCode();
	const char*			  specialized_vs_code_raw = specialized_vs_code.c_str();

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	for (unsigned int n_shader_type = 0; n_shader_type < 3; /* fs, gs, vs */
		 n_shader_type++)
	{
		glw::GLint compile_status	 = GL_FALSE;
		bool*	  out_compile_result = (n_shader_type == 0) ? out_has_fs_compiled_successfully :
														  (n_shader_type == 1) ? out_has_gs_compiled_successfully :
																				 out_has_vs_compiled_successfully;

		const char* so_code = (n_shader_type == 0) ?
								  specialized_fs_code_raw :
								  (n_shader_type == 1) ? specialized_gs_code_raw : specialized_vs_code_raw;

		glw::GLuint so_id = (n_shader_type == 0) ? m_fs_id : (n_shader_type == 1) ? m_gs_id : m_vs_id;

		gl.shaderSource(so_id, 1,			/* count */
						&so_code, DE_NULL); /* length */

		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

		*out_compile_result = (compile_status == GL_TRUE);
	} /* for (both shader stages) */
}